

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::_InternalParse
          (BayesianProbitRegressor_FeatureWeight *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint32_t uVar2;
  BayesianProbitRegressor_FeatureValueWeight *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = ptr;
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_48);
      if (bVar1) {
        return local_48;
      }
      local_48 = google::protobuf::internal::ReadTag(local_48,&local_3c,0);
      tag_00 = local_3c;
      if (local_3c >> 3 != 2) break;
      if ((char)local_3c == '\x12') {
        local_48 = local_48 + -1;
        do {
          local_48 = local_48 + 1;
          msg = google::protobuf::
                RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>
                ::Add(&this->weights_);
          local_48 = google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg->super_MessageLite,local_48);
          if (local_48 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == '\x12'));
      }
      else {
LAB_0028a818:
        if ((local_3c == 0) || ((local_3c & 7) == 4)) {
          if (local_48 == (char *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
          return local_48;
        }
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields<std::__cxx11::string>(local_38);
        local_48 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
        if (local_48 == (char *)0x0) {
          return (char *)0x0;
        }
      }
    }
    if ((local_3c >> 3 != 1) || ((char)local_3c != '\b')) goto LAB_0028a818;
    uVar2 = google::protobuf::internal::ReadVarint32(&local_48);
    this->featureid_ = uVar2;
    if (local_48 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* BayesianProbitRegressor_FeatureWeight::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint32 featureId = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          featureid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight weights = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_weights(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}